

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool mkvparser::PrimaryChromaticity::Parse
               (IMkvReader *reader,longlong read_pos,longlong value_size,bool is_x,
               PrimaryChromaticity **chromaticity)

{
  bool bVar1;
  PrimaryChromaticity *pPVar2;
  long lVar3;
  double parser_value;
  
  if (reader != (IMkvReader *)0x0) {
    pPVar2 = *chromaticity;
    if (pPVar2 == (PrimaryChromaticity *)0x0) {
      pPVar2 = (PrimaryChromaticity *)operator_new(8);
      pPVar2->x = 0.0;
      pPVar2->y = 0.0;
      *chromaticity = pPVar2;
    }
    parser_value = 0.0;
    lVar3 = UnserializeFloat(reader,read_pos,value_size,&parser_value);
    bVar1 = false;
    if (((-1 < lVar3) && (bVar1 = false, 0.0 <= parser_value)) &&
       (bVar1 = false, parser_value <= 1.0)) {
      if ((parser_value <= 0.0) || (1.1754943508222875e-38 <= parser_value)) {
        (&pPVar2->x)[!is_x] = (float)parser_value;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool PrimaryChromaticity::Parse(IMkvReader* reader, long long read_pos,
                                long long value_size, bool is_x,
                                PrimaryChromaticity** chromaticity) {
  if (!reader)
    return false;

  if (!*chromaticity)
    *chromaticity = new PrimaryChromaticity();

  if (!*chromaticity)
    return false;

  PrimaryChromaticity* pc = *chromaticity;
  float* value = is_x ? &pc->x : &pc->y;

  double parser_value = 0;
  const long long parse_status =
      UnserializeFloat(reader, read_pos, value_size, parser_value);

  // Valid range is [0, 1]. Make sure the double is representable as a float
  // before casting.
  if (parse_status < 0 || parser_value < 0.0 || parser_value > 1.0 ||
      (parser_value > 0.0 && parser_value < FLT_MIN))
    return false;

  *value = static_cast<float>(parser_value);

  return true;
}